

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void MOJOSHADER_glDeleteEffect(MOJOSHADER_glEffect *glEffect)

{
  MOJOSHADER_free p_Var1;
  void *pvVar2;
  void *d;
  MOJOSHADER_free f;
  int i;
  MOJOSHADER_glEffect *glEffect_local;
  
  p_Var1 = glEffect->effect->free;
  pvVar2 = glEffect->effect->malloc_data;
  for (f._4_4_ = 0; f._4_4_ < glEffect->num_shaders; f._4_4_ = f._4_4_ + 1) {
    glEffect->shaders[(int)f._4_4_].refcount = glEffect->shaders[(int)f._4_4_].refcount + 1;
    MOJOSHADER_glDeleteShader(glEffect->shaders + (int)f._4_4_);
    (*ctx->profileDeleteShader)(glEffect->shaders[(int)f._4_4_].handle);
  }
  (*p_Var1)(glEffect->shader_indices,pvVar2);
  (*p_Var1)(glEffect->preshader_indices,pvVar2);
  (*p_Var1)(glEffect,pvVar2);
  return;
}

Assistant:

void MOJOSHADER_glDeleteEffect(MOJOSHADER_glEffect *glEffect)
{
    int i;
    MOJOSHADER_free f = glEffect->effect->free;
    void *d = glEffect->effect->malloc_data;

    for (i = 0; i < glEffect->num_shaders; i++)
    {
        /* Arbitarily add a reference to the refcount.
         * We're going to be calling glDeleteShader so we can clean out the
         * program cache, but we can NOT let it free() the array elements!
         * We'll do that ourselves, as we malloc()'d in CompileEffect.
         * -flibit
         */
        glEffect->shaders[i].refcount++;
        MOJOSHADER_glDeleteShader(&glEffect->shaders[i]);

        /* Delete the shader, but do NOT delete the parse data!
         * The parse data belongs to the parent effect.
         * -flibit
         */
        ctx->profileDeleteShader(glEffect->shaders[i].handle);
    } // for

    f(glEffect->shader_indices, d);
    f(glEffect->preshader_indices, d);
    f(glEffect, d);
}